

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

void chip_generate(opl_chip *chip,Bit16s *buff)

{
  Bit16s BVar1;
  byte local_26;
  byte local_25;
  ushort local_24;
  byte local_22;
  byte local_21;
  byte local_20;
  byte local_1f;
  Bit8u ii_6;
  Bit8u jj_1;
  Bit16s accm_1;
  Bit8u ii_5;
  Bit8u ii_4;
  Bit8u ii_3;
  Bit8u jj;
  Bit16s accm;
  Bit8u ii_2;
  Bit8u ii_1;
  Bit8u ii;
  Bit16s *buff_local;
  opl_chip *chip_local;
  
  BVar1 = limshort(chip->mixbuff[1]);
  buff[1] = BVar1;
  for (ii_4 = '\0'; ii_4 < 0xc; ii_4 = ii_4 + '\x01') {
    slot_calcfb(chip->slot + ii_4);
    pg_generate(chip->slot + ii_4);
    envelope_calc(chip->slot + ii_4);
    slot_generate(chip->slot + ii_4);
  }
  for (ii_5 = '\f'; ii_5 < 0xf; ii_5 = ii_5 + '\x01') {
    slot_calcfb(chip->slot + ii_5);
    pg_generate(chip->slot + ii_5);
    envelope_calc(chip->slot + ii_5);
  }
  if ((chip->rhy & 0x20) == 0) {
    slot_generate(chip->slot + 0xc);
    slot_generate(chip->slot + 0xd);
    slot_generate(chip->slot + 0xe);
  }
  else {
    chan_generaterhythm1(chip);
  }
  chip->mixbuff[0] = 0;
  for (accm_1._1_1_ = 0; accm_1._1_1_ < 0x12; accm_1._1_1_ = accm_1._1_1_ + 1) {
    _ii_6 = 0;
    for (local_1f = 0; local_1f < 4; local_1f = local_1f + 1) {
      _ii_6 = _ii_6 + *chip->channel[accm_1._1_1_].out[local_1f];
    }
    if (chip->FullPan == '\0') {
      chip->mixbuff[0] = (int)(short)(_ii_6 & chip->channel[accm_1._1_1_].cha) + chip->mixbuff[0];
    }
    else {
      chip->mixbuff[0] =
           (int)(short)(int)((float)(int)(short)_ii_6 * chip->channel[accm_1._1_1_].fcha) +
           chip->mixbuff[0];
    }
  }
  for (local_20 = 0xf; local_20 < 0x12; local_20 = local_20 + 1) {
    slot_calcfb(chip->slot + local_20);
    pg_generate(chip->slot + local_20);
    envelope_calc(chip->slot + local_20);
  }
  if ((chip->rhy & 0x20) == 0) {
    slot_generate(chip->slot + 0xf);
    slot_generate(chip->slot + 0x10);
    slot_generate(chip->slot + 0x11);
  }
  else {
    chan_generaterhythm2(chip);
  }
  BVar1 = limshort(chip->mixbuff[0]);
  *buff = BVar1;
  for (local_21 = 0x12; local_21 < 0x21; local_21 = local_21 + 1) {
    slot_calcfb(chip->slot + local_21);
    pg_generate(chip->slot + local_21);
    envelope_calc(chip->slot + local_21);
    slot_generate(chip->slot + local_21);
  }
  chip->mixbuff[1] = 0;
  for (local_22 = 0; local_22 < 0x12; local_22 = local_22 + 1) {
    local_24 = 0;
    for (local_25 = 0; local_25 < 4; local_25 = local_25 + 1) {
      local_24 = local_24 + *chip->channel[local_22].out[local_25];
    }
    if (chip->FullPan == '\0') {
      chip->mixbuff[1] = (int)(short)(local_24 & chip->channel[local_22].chb) + chip->mixbuff[1];
    }
    else {
      chip->mixbuff[1] =
           (int)(short)(int)((float)(int)(short)local_24 * chip->channel[local_22].fchb) +
           chip->mixbuff[1];
    }
  }
  for (local_26 = 0x21; local_26 < 0x24; local_26 = local_26 + 1) {
    slot_calcfb(chip->slot + local_26);
    pg_generate(chip->slot + local_26);
    envelope_calc(chip->slot + local_26);
    slot_generate(chip->slot + local_26);
  }
  n_generate(chip);
  if ((chip->timer & 0x3f) == 0x3f) {
    if (chip->tremdir == '\0') {
      if (chip->tremtval == 'i') {
        chip->tremtval = chip->tremtval + 0xff;
        chip->tremdir = '\x01';
      }
      else {
        chip->tremtval = chip->tremtval + '\x01';
      }
    }
    else if (chip->tremtval == '\0') {
      chip->tremtval = chip->tremtval + '\x01';
      chip->tremdir = '\0';
    }
    else {
      chip->tremtval = chip->tremtval + 0xff;
    }
    chip->tremval =
         (Bit8u)(((int)(uint)chip->tremtval >> 2) >> (('\x01' - chip->dam) * '\x02' & 0x1f));
  }
  chip->timer = chip->timer + 1;
  return;
}

Assistant:

void chip_generate(opl_chip *chip, Bit16s *buff) {
	buff[1] = limshort(chip->mixbuff[1]);

	for (Bit8u ii = 0; ii < 12; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	for (Bit8u ii = 12; ii < 15; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm1(chip);
	}
	else {
		slot_generate(&chip->slot[12]);
		slot_generate(&chip->slot[13]);
		slot_generate(&chip->slot[14]);
	}

	chip->mixbuff[0] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[0] += (Bit16s)(accm * chip->channel[ii].fcha);
		}
		else {
			chip->mixbuff[0] += (Bit16s)(accm & chip->channel[ii].cha);
		}
	}

	for (Bit8u ii = 15; ii < 18; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm2(chip);
	}
	else {
		slot_generate(&chip->slot[15]);
		slot_generate(&chip->slot[16]);
		slot_generate(&chip->slot[17]);
	}

	buff[0] = limshort(chip->mixbuff[0]);

	for (Bit8u ii = 18; ii < 33; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	chip->mixbuff[1] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[1] += (Bit16s)(accm * chip->channel[ii].fchb);
		}
		else {
			chip->mixbuff[1] += (Bit16s)(accm & chip->channel[ii].chb);
		}
	}

	for (Bit8u ii = 33; ii < 36; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	n_generate(chip);

	if ((chip->timer & 0x3f) == 0x3f) {
		if (!chip->tremdir) {
			if (chip->tremtval == 105) {
				chip->tremtval--;
				chip->tremdir = 1;
			}
			else {
				chip->tremtval++;
			}
		}
		else {
			if (chip->tremtval == 0) {
				chip->tremtval++;
				chip->tremdir = 0;
			}
			else {
				chip->tremtval--;
			}
		}
		chip->tremval = (chip->tremtval >> 2) >> ((1 - chip->dam) << 1);
	}

	chip->timer++;
}